

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int FreeEXRImage(EXRImage *exr_image)

{
  uchar *puVar1;
  uchar **ppuVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  if (exr_image == (EXRImage *)0x0) {
    return -3;
  }
  iVar3 = exr_image->num_channels;
  if (0 < iVar3) {
    lVar5 = 0;
    do {
      if ((exr_image->images != (uchar **)0x0) &&
         (puVar1 = exr_image->images[lVar5], puVar1 != (uchar *)0x0)) {
        free(puVar1);
        iVar3 = exr_image->num_channels;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar3);
  }
  if (exr_image->images != (uchar **)0x0) {
    free(exr_image->images);
  }
  if ((exr_image->tiles != (EXRTile *)0x0) && (0 < exr_image->num_tiles)) {
    lVar5 = 0;
    do {
      iVar3 = exr_image->num_channels;
      if (0 < iVar3) {
        lVar4 = 0;
        do {
          ppuVar2 = exr_image->tiles[lVar5].images;
          if ((ppuVar2 != (uchar **)0x0) && (puVar1 = ppuVar2[lVar4], puVar1 != (uchar *)0x0)) {
            free(puVar1);
            iVar3 = exr_image->num_channels;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < iVar3);
      }
      ppuVar2 = exr_image->tiles[lVar5].images;
      if (ppuVar2 != (uchar **)0x0) {
        free(ppuVar2);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < exr_image->num_tiles);
  }
  return 0;
}

Assistant:

int FreeEXRImage(EXRImage *exr_image) {
  if (exr_image == NULL) {
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  for (int i = 0; i < exr_image->num_channels; i++) {
    if (exr_image->images && exr_image->images[i]) {
      free(exr_image->images[i]);
    }
  }

  if (exr_image->images) {
    free(exr_image->images);
  }

  if (exr_image->tiles) {
    for (int tid = 0; tid < exr_image->num_tiles; tid++) {
      for (int i = 0; i < exr_image->num_channels; i++) {
        if (exr_image->tiles[tid].images && exr_image->tiles[tid].images[i]) {
          free(exr_image->tiles[tid].images[i]);
        }
      }
      if (exr_image->tiles[tid].images) {
        free(exr_image->tiles[tid].images);
      }
    }
  }

  return TINYEXR_SUCCESS;
}